

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_7ac08::lower_tess_level_visitor::visit
          (lower_tess_level_visitor *this,ir_variable *ir)

{
  glsl_type *pgVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var;
  exec_node *peVar5;
  glsl_type **ppgVar6;
  long lVar7;
  char *pcVar8;
  
  pcVar8 = ir->name;
  if (pcVar8 != (char *)0x0) {
    iVar2 = strcmp(pcVar8,"gl_TessLevelInner");
    if ((iVar2 != 0) && (iVar3 = strcmp(pcVar8,"gl_TessLevelOuter"), iVar3 != 0)) {
      return visit_continue;
    }
    pgVar1 = ir->type;
    if (pgVar1->field_0x4 != '\x11') {
      __assert_fail("ir->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x6e,
                    "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                   );
    }
    iVar3 = strcmp(pcVar8,"gl_TessLevelOuter");
    if (iVar3 == 0) {
      if (this->old_tess_level_outer_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_outer_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x75,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      ppgVar6 = &glsl_type::vec4_type;
      pcVar8 = "gl_TessLevelOuterMESA";
      lVar7 = 0x48;
    }
    else {
      if (iVar2 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x93,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      if (this->old_tess_level_inner_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_inner_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x86,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      ppgVar6 = &glsl_type::vec2_type;
      pcVar8 = "gl_TessLevelInnerMESA";
      lVar7 = 0x50;
    }
    pvVar4 = ralloc_parent(ir);
    iVar2 = (*(ir->super_ir_instruction)._vptr_ir_instruction[4])(ir,pvVar4,0);
    *(void **)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                      super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lVar7) =
         (void *)CONCAT44(extraout_var,iVar2);
    pcVar8 = ralloc_strdup((void *)CONCAT44(extraout_var,iVar2),pcVar8);
    lVar7 = *(long *)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                             super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lVar7);
    *(char **)(lVar7 + 0x28) = pcVar8;
    *(glsl_type **)(lVar7 + 0x20) = *ppgVar6;
    *(undefined4 *)(lVar7 + 0x60) = 0;
    peVar5 = (exec_node *)(lVar7 + 8);
    if (lVar7 == 0) {
      peVar5 = (exec_node *)0x0;
    }
    peVar5->prev = (ir->super_ir_instruction).super_exec_node.prev;
    peVar5->next = (ir->super_ir_instruction).super_exec_node.next;
    ((ir->super_ir_instruction).super_exec_node.prev)->next = peVar5;
    ((ir->super_ir_instruction).super_exec_node.next)->prev = peVar5;
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_tess_level_visitor::visit(ir_variable *ir)
{
   if ((!ir->name) ||
       ((strcmp(ir->name, "gl_TessLevelInner") != 0) &&
        (strcmp(ir->name, "gl_TessLevelOuter") != 0)))
      return visit_continue;

   assert (ir->type->is_array());

   if (strcmp(ir->name, "gl_TessLevelOuter") == 0) {
      if (this->old_tess_level_outer_var)
         return visit_continue;

      old_tess_level_outer_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_outer_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_outer_var->name = ralloc_strdup(new_tess_level_outer_var,
                                                "gl_TessLevelOuterMESA");
      new_tess_level_outer_var->type = glsl_type::vec4_type;
      new_tess_level_outer_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_outer_var);
   } else if (strcmp(ir->name, "gl_TessLevelInner") == 0) {
      if (this->old_tess_level_inner_var)
         return visit_continue;

      old_tess_level_inner_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_inner_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_inner_var->name = ralloc_strdup(new_tess_level_inner_var,
                                                "gl_TessLevelInnerMESA");
      new_tess_level_inner_var->type = glsl_type::vec2_type;
      new_tess_level_inner_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_inner_var);
   } else {
      assert(0);
   }

   this->progress = true;

   return visit_continue;
}